

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>::
emplaceRealloc<slang::ast::CheckerInstanceBodySymbol&,slang::ast::Symbol_const&,slang::syntax::ExpressionSyntax_const*&,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>&>
          (SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection> *this,pointer pos,
          CheckerInstanceBodySymbol *args,Symbol *args_1,ExpressionSyntax **args_2,
          span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> *args_3)

{
  ulong uVar1;
  ExpressionSyntax *pEVar2;
  pointer p;
  size_type sVar3;
  pointer ppAVar4;
  size_t sVar5;
  pointer pCVar6;
  pointer pCVar7;
  pointer pCVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  pointer pCVar12;
  undefined8 *puVar13;
  pointer pCVar14;
  undefined8 *puVar15;
  ulong uVar16;
  byte bVar17;
  
  bVar17 = 0;
  if (this->len == 0x1c71c71c71c71c7) {
    detail::throwLengthError();
  }
  uVar16 = this->len + 1;
  uVar1 = this->cap;
  if (uVar16 < uVar1 * 2) {
    uVar16 = uVar1 * 2;
  }
  if (0x1c71c71c71c71c7 - uVar1 < uVar1) {
    uVar16 = 0x1c71c71c71c71c7;
  }
  lVar11 = (long)pos - (long)this->data_;
  pCVar8 = (pointer)operator_new(uVar16 * 0x48);
  pEVar2 = *args_2;
  ppAVar4 = args_3->_M_ptr;
  sVar5 = (args_3->_M_extent)._M_extent_value;
  *(CheckerInstanceBodySymbol **)((long)pCVar8 + lVar11) = args;
  *(Symbol **)((long)pCVar8 + lVar11 + 8) = args_1;
  *(undefined8 *)((long)pCVar8 + lVar11 + 0x10) = 0;
  *(undefined1 *)((long)pCVar8 + lVar11 + 0x18) = 0;
  puVar13 = (undefined8 *)((long)pCVar8 + lVar11 + 0x20);
  *puVar13 = ppAVar4;
  puVar13[1] = sVar5;
  *(ExpressionSyntax **)((long)pCVar8 + lVar11 + 0x30) = pEVar2;
  *(undefined1 *)((long)pCVar8 + lVar11 + 0x40) = 0;
  p = this->data_;
  sVar3 = this->len;
  lVar9 = (long)p + (sVar3 * 0x48 - (long)pos);
  pCVar6 = p;
  pCVar7 = pCVar8;
  if (lVar9 == 0) {
    if (sVar3 != 0) {
      lVar9 = 0;
      do {
        puVar13 = (undefined8 *)((long)&p->parent + lVar9);
        puVar15 = (undefined8 *)((long)&pCVar8->parent + lVar9);
        for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
          *puVar15 = *puVar13;
          puVar13 = puVar13 + (ulong)bVar17 * -2 + 1;
          puVar15 = puVar15 + (ulong)bVar17 * -2 + 1;
        }
        lVar9 = lVar9 + 0x48;
      } while (sVar3 * 0x48 != lVar9);
    }
  }
  else {
    for (; pCVar6 != pos; pCVar6 = pCVar6 + 1) {
      pCVar12 = pCVar6;
      pCVar14 = pCVar7;
      for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
        pCVar14->parent = pCVar12->parent;
        pCVar12 = (pointer)((long)pCVar12 + (ulong)bVar17 * -0x10 + 8);
        pCVar14 = (pointer)((long)pCVar14 + ((ulong)bVar17 * -2 + 1) * 8);
      }
      pCVar7 = pCVar7 + 1;
    }
    memcpy((void *)((long)pCVar8 + lVar11 + 0x48),pos,((lVar9 - 0x48U) / 0x48) * 0x48 + 0x48);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar16;
  this->data_ = pCVar8;
  return (pointer)((long)pCVar8 + lVar11);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}